

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_file_cache.cpp
# Opt level: O2

void __thiscall duckdb::ExternalFileCache::CachedFileRange::~CachedFileRange(CachedFileRange *this)

{
  ::std::__cxx11::string::~string((string *)&this->version_tag);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->block_handle).internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

ExternalFileCache::CachedFileRange::~CachedFileRange() {
	VerifyCheckSum();
}